

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Expected<llvm::DWARFDebugRnglistTable> *
parseRngListTableHeader
          (Expected<llvm::DWARFDebugRnglistTable> *__return_storage_ptr__,DWARFDataExtractor *DA,
          uint64_t Offset,DwarfFormat Format)

{
  size_t *Err;
  uint64_t uVar1;
  byte bVar2;
  char *Fmt;
  error_code EC;
  undefined1 local_d8 [8];
  DWARFDebugRnglistTable Table;
  Error local_38;
  uint64_t local_30;
  uint64_t Offset_local;
  
  uVar1 = Offset;
  if (Offset != 0) {
    local_30 = Offset;
    bVar2 = llvm::DWARFListTableHeader::getHeaderSize(Format);
    uVar1 = Offset - bVar2;
    if (Offset < bVar2) {
      Fmt = (char *)std::_V2::generic_category();
      Err = &Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length;
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = Err;
      llvm::createStringError<unsigned_long>
                (EC,Fmt,(unsigned_long *)
                        "Did not detect a valid range list table with base = 0x%lx\n");
      llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,(Error *)Err);
      if ((long *)(Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length &
                  0xfffffffffffffffe) == (long *)0x0) {
        return __return_storage_ptr__;
      }
      (**(code **)(*(long *)(Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.
                             Length & 0xfffffffffffffffe) + 8))();
      return __return_storage_ptr__;
    }
  }
  local_30 = uVar1;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_parent = (_Base_ptr)&Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap
  ;
  local_d8 = (undefined1  [8])0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Version = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.AddrSize = '\0';
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.SegSize = '\0';
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.OffsetEntryCount = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset =
       (uint64_t)anon_var_dwarf_39af8fc;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data = (char *)0xf;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Length =
       (long)"DW_TAG_generic_subrange" + 0x12;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.Data = (char *)0x5;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl._0_4_ = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_color = _S_red;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._4_4_ = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_right = (_Base_ptr)0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_node_count = (long)"DIE address ranges are not contained in its parent\'s ranges:" + 0x35;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data = (char *)0x7;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_left =
       Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
       super__Rb_tree_header._M_header._M_parent;
  llvm::DWARFListTableHeader::extract
            ((DWARFListTableHeader *)&Offset_local,*DA,(uint64_t *)local_d8);
  if (Offset_local < 2) {
    llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected<llvm::DWARFDebugRnglistTable>
              (__return_storage_ptr__,(DWARFDebugRnglistTable *)local_d8,(type *)0x0);
  }
  else {
    local_38.Payload = (ErrorInfoBase *)(Offset_local | 1);
    Offset_local = 0;
    llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,&local_38);
    if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)(Offset_local & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(Offset_local & 0xfffffffffffffffe) + 8))();
    }
  }
  llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::~DWARFListTableBase
            ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

static Expected<DWARFDebugRnglistTable>
parseRngListTableHeader(DWARFDataExtractor &DA, uint64_t Offset,
                        DwarfFormat Format) {
  // We are expected to be called with Offset 0 or pointing just past the table
  // header. Correct Offset in the latter case so that it points to the start
  // of the header.
  if (Offset > 0) {
    uint64_t HeaderSize = DWARFListTableHeader::getHeaderSize(Format);
    if (Offset < HeaderSize)
      return createStringError(errc::invalid_argument, "Did not detect a valid"
                               " range list table with base = 0x%" PRIx64 "\n",
                               Offset);
    Offset -= HeaderSize;
  }
  llvm::DWARFDebugRnglistTable Table;
  if (Error E = Table.extractHeaderAndOffsets(DA, &Offset))
    return std::move(E);
  return Table;
}